

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

Type __thiscall wasm::TypeBuilder::getTempTupleType(TypeBuilder *this,Tuple *tuple)

{
  pointer this_00;
  size_type sVar1;
  TypeInfo local_48;
  Type local_28;
  Type ret;
  Tuple *tuple_local;
  TypeBuilder *this_local;
  
  ret.id = (uintptr_t)tuple;
  this_00 = std::unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
            ::operator->(&this->impl);
  anon_unknown_0::TypeInfo::TypeInfo(&local_48,(Tuple *)ret.id);
  local_28.id = (uintptr_t)
                anon_unknown_0::Store<wasm::(anonymous_namespace)::TypeInfo>::insert
                          (&this_00->typeStore,&local_48);
  anon_unknown_0::TypeInfo::~TypeInfo(&local_48);
  sVar1 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)ret.id);
  if (sVar1 < 2) {
    this_local = (TypeBuilder *)local_28.id;
  }
  else {
    this_local = (TypeBuilder *)anon_unknown_0::markTemp(local_28);
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type TypeBuilder::getTempTupleType(const Tuple& tuple) {
  Type ret = impl->typeStore.insert(tuple);
  if (tuple.types.size() > 1) {
    return markTemp(ret);
  } else {
    // No new tuple was created, so the result might not be temporary.
    return ret;
  }
}